

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_ptr.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int *piVar2;
  size_t in_R8;
  size_t i_1;
  ulong uVar3;
  size_t i;
  long lVar4;
  GlobalPtr<char> dst;
  GlobalPtr<int> dst_00;
  GlobalPtr<int> src;
  allocator_type local_49;
  GlobalPtr<int> local_48;
  int local_34;
  vector<int,_std::allocator<int>_> zeros;
  
  BCL::init((BCL *)0x100,(EVP_PKEY_CTX *)0x0);
  if (1 < BCL::my_nprocs) {
    local_48 = (GlobalPtr<int>)ZEXT816(0);
    if (BCL::my_rank == 0) {
      local_48 = BCL::local_malloc<int>(BCL::my_nprocs);
    }
    local_48 = BCL::broadcast<BCL::GlobalPtr<int>>(&local_48,0);
    local_34 = (int)BCL::my_rank;
    zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
         BCL::GlobalPtr<int>::operator[](&local_48,BCL::my_rank);
    BCL::GlobalRef<int>::operator=((GlobalRef<int> *)&zeros,&local_34);
    BCL::barrier();
    if (BCL::my_rank == 0) {
      piVar2 = BCL::GlobalPtr<int>::local(&local_48);
      puts("Rank 0 Sees:");
      for (uVar3 = 0; uVar3 < BCL::my_nprocs; uVar3 = uVar3 + 1) {
        printf("%lu: %d\n",uVar3,(ulong)(uint)piVar2[uVar3]);
      }
    }
    BCL::barrier();
    if (BCL::my_rank == 1) {
      local_34 = 0;
      std::vector<int,_std::allocator<int>_>::vector(&zeros,BCL::my_nprocs,&local_34,&local_49);
      dst.ptr = (long)zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
      dst.rank = local_48.ptr;
      BCL::write<char>((BCL *)zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,(char *)local_48.rank,dst,in_R8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&zeros.super__Vector_base<int,_std::allocator<int>_>);
    }
    BCL::barrier();
    zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = (int)BCL::my_rank;
    dst_00.ptr = BCL::my_rank * 4 + local_48.ptr;
    dst_00.rank = local_48.rank;
    BCL::rput<int>((int *)&zeros,dst_00);
    BCL::barrier();
    if (BCL::my_rank == 1) {
      puts("Rank 1 Sees:");
      lVar4 = 0;
      for (uVar3 = 0; uVar3 < BCL::my_nprocs; uVar3 = uVar3 + 1) {
        src.ptr = local_48.ptr + lVar4;
        src.rank = local_48.rank;
        uVar1 = BCL::rget<int>(src);
        printf("%lu: %d\n",uVar3,(ulong)uVar1);
        lVar4 = lVar4 + 4;
      }
    }
    BCL::finalize();
    return 0;
  }
  __assert_fail("BCL::nprocs() >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/berkeley-container-library[P]bcl/examples/simple/global_ptr.cpp"
                ,0x22,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  BCL::init();

  // Need to run this with at least two processes.
  assert(BCL::nprocs() >= 2);

  BCL::GlobalPtr<int> ptr = nullptr;

  if (BCL::rank() == 0) {
    ptr = BCL::alloc<int>(BCL::nprocs());
  }

  ptr = BCL::broadcast(ptr, 0);

  // 1) Using pointer dereference
  //    to write a value.
  ptr[BCL::rank()] = BCL::rank();

  BCL::barrier();

  if (BCL::rank() == 0) {
    // 2) Calling .local() to get a local pointer.
    int* local = ptr.local();

    printf("Rank 0 Sees:\n");
    for (size_t i = 0; i < BCL::nprocs(); i++) {
      printf("%lu: %d\n", i, local[i]);
    }
  }

  BCL::barrier();

  if (BCL::rank() == 1) {
    std::vector<int> zeros(BCL::nprocs(), 0);
    // 3) Using BCL::memcpy.
    BCL::memcpy(ptr, zeros.data(), sizeof(int)*zeros.size());
  }

  BCL::barrier();

  // 4) Using rput
  BCL::rput((int) BCL::rank(), ptr + BCL::rank());

  BCL::barrier();

  if (BCL::rank() == 1) {
    printf("Rank 1 Sees:\n");
    for (size_t i = 0; i < BCL::nprocs(); i++) {
      // 4) Using rget
      printf("%lu: %d\n", i, BCL::rget(ptr + i));
    }
  }

  BCL::finalize();
  return 0;
}